

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall
leveldb::anon_unknown_1::PosixSequentialFile::Read
          (PosixSequentialFile *this,size_t n,Slice *result,char *scratch)

{
  int iVar1;
  int *piVar2;
  char *in_R8;
  Status local_68;
  Slice local_60 [2];
  Slice *local_40;
  size_t r;
  char *local_30;
  char *scratch_local;
  Slice *result_local;
  size_t n_local;
  PosixSequentialFile *this_local;
  Status *s;
  
  r._7_1_ = 0;
  local_30 = in_R8;
  scratch_local = scratch;
  result_local = result;
  n_local = n;
  this_local = this;
  Status::Status((Status *)this);
  local_40 = (Slice *)fread_unlocked(local_30,1,(size_t)result_local,*(FILE **)(n + 0x28));
  Slice::Slice(local_60,local_30,(size_t)local_40);
  *(char **)scratch_local = local_60[0].data_;
  *(size_t *)(scratch_local + 8) = local_60[0].size_;
  if ((local_40 < result_local) && (iVar1 = feof(*(FILE **)(n + 0x28)), iVar1 == 0)) {
    piVar2 = __errno_location();
    IOError((anon_unknown_1 *)&local_68,(string *)(n + 8),*piVar2);
    Status::operator=((Status *)this,&local_68);
    Status::~Status(&local_68);
  }
  return (Status)(char *)this;
}

Assistant:

virtual Status Read(size_t n, Slice *result, char *scratch) {
                Status s;
                size_t r = fread_unlocked(scratch, 1, n, file_);
                *result = Slice(scratch, r);
                if (r < n) {
                    if (feof(file_)) {
                        // We leave status as ok if we hit the end of the file
                    } else {
                        // A partial read with an error: return a non-ok status
                        s = IOError(filename_, errno);
                    }
                }
                return s;
            }